

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::updateIndexedViews
          (ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  int iVar1;
  pointer ptVar2;
  element_type *peVar3;
  ManagedBuffer<unsigned_int> *this_00;
  int iVar4;
  byte bVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer ptVar6;
  bool bVar7;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  expandData;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  local_48;
  
  checkDeviceBufferTypeIs(this,Attribute);
  removeDeletedIndexedViews(this);
  ptVar6 = (this->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar2 = (this->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar6 != ptVar2) {
    do {
      this_01 = (ptVar6->
                super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                ).super__Tuple_impl<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>_>.
                super__Head_base<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>,_false>.
                _M_head_impl.
                super___weak_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar4 = this_01->_M_use_count;
        do {
          if (iVar4 == 0) {
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          in_RCX = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(iVar4 + 1U);
          LOCK();
          iVar1 = this_01->_M_use_count;
          bVar7 = iVar4 == iVar1;
          if (bVar7) {
            this_01->_M_use_count = iVar4 + 1U;
            iVar1 = iVar4;
          }
          iVar4 = iVar1;
          UNLOCK();
        } while (!bVar7);
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = this_01->_M_use_count == 0;
      }
      peVar3 = (ptVar6->
               super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
               ).super__Tuple_impl<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>_>.
               super__Head_base<1UL,_std::weak_ptr<polyscope::render::AttributeBuffer>,_false>.
               _M_head_impl.
               super___weak_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      bVar5 = peVar3 == (element_type *)0x0 | bVar7;
      in_RCX = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
      if (bVar5 == 0) {
        this_00 = (ptVar6->
                  super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                  ).super__Head_base<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_false>.
                  _M_head_impl;
        ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(this_00);
        gather<glm::vec<4,unsigned_int,(glm::qualifier)0>>
                  (&local_48,(polyscope *)this->data,
                   (vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                    *)this_00->data,in_RCX);
        (**(code **)((long)peVar3->_vptr_AttributeBuffer + 0x58))(peVar3,&local_48);
        if (local_48.
            super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      ptVar6 = ptVar6 + 1;
    } while (ptVar6 != ptVar2);
  }
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::updateIndexedViews() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (!viewBufferPtr) continue; // skip if it has been deleted (will be removed eventually)

    // note: index buffer must still be alive here. we can't check it, you will just get memory errors
    // if it has been deleted
    render::ManagedBuffer<uint32_t>& indices = *std::get<0>(existingViewTup);
    render::AttributeBuffer& viewBuffer = *viewBufferPtr;

    // apply the indexing and set the data
    indices.ensureHostBufferPopulated();
    std::vector<T> expandData = gather(data, indices.data);
    viewBuffer.setData(expandData);

    // TODO fornow, only CPU-side updating is supported. Add direct GPU-side support using the bufferIndexCopyProgram
    // below.
  }

  requestRedraw();
}